

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SplitterBehavior
               (ImRect *bb,ImGuiID id,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend,float hover_visibility_delay)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiAxis IVar3;
  bool bVar4;
  ImU32 col;
  ImGuiCol idx;
  undefined1 uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool held;
  bool hovered;
  float local_88;
  float local_84;
  float local_80;
  ImGuiAxis local_7c;
  float *local_78;
  float *local_70;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImRect local_58;
  float local_48;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  uVar6 = (pIVar1->DC).ItemFlags;
  (pIVar1->DC).ItemFlags = uVar6 | 0x18;
  local_88 = hover_visibility_delay;
  local_84 = min_size1;
  local_80 = min_size2;
  local_7c = axis;
  local_78 = size1;
  local_70 = size2;
  local_48 = hover_extend;
  bVar4 = ItemAdd(bb,id,(ImRect *)0x0);
  IVar3 = local_7c;
  (pIVar1->DC).ItemFlags = uVar6;
  uVar5 = 0;
  if (bVar4) {
    fVar8 = (float)((uint)local_48 & (int)((uint)(local_7c == ImGuiAxis_Y) << 0x1f) >> 0x1f);
    fVar7 = (float)(~((int)((uint)(local_7c == ImGuiAxis_Y) << 0x1f) >> 0x1f) & (uint)local_48);
    local_58.Min.x = (bb->Min).x;
    local_58.Min.y = (bb->Min).y;
    local_58.Max.x = (bb->Max).x;
    local_58.Max.y = (bb->Max).y;
    local_58.Min.y = local_58.Min.y - fVar8;
    local_58.Min.x = local_58.Min.x - fVar7;
    local_58.Max.y = fVar8 + local_58.Max.y;
    local_58.Max.x = fVar7 + local_58.Max.x;
    ButtonBehavior(&local_58,id,&hovered,&held,0x1800);
    if (pIVar2->ActiveId != id) {
      SetItemAllowOverlap();
    }
    if ((held != false) ||
       (((pIVar2->HoveredId == id && (pIVar2->HoveredIdPreviousFrame == id)) &&
        (local_88 <= pIVar2->HoveredIdTimer)))) {
      SetMouseCursor((IVar3 != ImGuiAxis_Y) + 3);
    }
    local_68 = bb->Min;
    IStack_60 = bb->Max;
    if ((held & 1U) != 0) {
      if (IVar3 == ImGuiAxis_Y) {
        fVar7 = ((pIVar2->IO).MousePos.y - (pIVar2->ActiveIdClickOffset).y) - local_58.Min.y;
      }
      else {
        fVar7 = ((pIVar2->IO).MousePos.x - (pIVar2->ActiveIdClickOffset).x) - local_58.Min.x;
      }
      fVar9 = *local_78 - local_84;
      fVar8 = *local_70 - local_80;
      fVar8 = (float)(~-(uint)(fVar8 <= 0.0) & (uint)fVar8);
      fVar10 = -fVar9;
      uVar6 = -(uint)(fVar9 <= fVar10);
      fVar9 = (float)(~uVar6 & (uint)fVar10 | uVar6 & 0x80000000);
      if (fVar9 <= fVar7) {
        fVar9 = fVar7;
      }
      if (fVar9 <= fVar8) {
        fVar8 = fVar9;
      }
      if ((fVar8 != 0.0) || (NAN(fVar8))) {
        fVar7 = *local_78 + fVar8;
        if ((fVar8 < 0.0) && (fVar7 < local_84)) {
          __assert_fail("*size1 + mouse_delta >= min_size1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                        ,0x590,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float)"
                       );
        }
        if ((0.0 < fVar8) && (*local_70 - fVar8 < local_80)) {
          __assert_fail("*size2 - mouse_delta >= min_size2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                        ,0x592,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float)"
                       );
        }
        *local_78 = fVar7;
        *local_70 = *local_70 - fVar8;
        fVar7 = (float)((uint)fVar8 & (int)((uint)(IVar3 == ImGuiAxis_X) << 0x1f) >> 0x1f);
        fVar8 = (float)(~((int)((uint)(IVar3 == ImGuiAxis_X) << 0x1f) >> 0x1f) & (uint)fVar8);
        local_68.y = fVar8 + local_68.y;
        local_68.x = fVar7 + local_68.x;
        IStack_60.y = fVar8 + IStack_60.y;
        IStack_60.x = fVar7 + IStack_60.x;
        MarkItemEdited(id);
      }
    }
    if ((held & 1U) == 0) {
      if (hovered == true) {
        idx = 0x1c - (uint)(pIVar2->HoveredIdTimer < local_88);
      }
      else {
        idx = 0x1b;
      }
    }
    else {
      idx = 0x1d;
    }
    col = GetColorU32(idx,1.0);
    ImDrawList::AddRectFilled(pIVar1->DrawList,&local_68,&IStack_60,col,0.0,0xf);
    uVar5 = held;
  }
  return (bool)uVar5;
}

Assistant:

bool ImGui::SplitterBehavior(const ImRect& bb, ImGuiID id, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend, float hover_visibility_delay)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    window->DC.ItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (g.HoveredId == id && g.HoveredIdPreviousFrame == id && g.HoveredIdTimer >= hover_visibility_delay))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        float size_1_maximum_delta = ImMax(0.0f, *size1 - min_size1);
        float size_2_maximum_delta = ImMax(0.0f, *size2 - min_size2);
        if (mouse_delta < -size_1_maximum_delta)
            mouse_delta = -size_1_maximum_delta;
        if (mouse_delta > size_2_maximum_delta)
            mouse_delta = size_2_maximum_delta;

        // Apply resize
        if (mouse_delta != 0.0f)
        {
            if (mouse_delta < 0.0f)
                IM_ASSERT(*size1 + mouse_delta >= min_size1);
            if (mouse_delta > 0.0f)
                IM_ASSERT(*size2 - mouse_delta >= min_size2);
            *size1 += mouse_delta;
            *size2 -= mouse_delta;
            bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
            MarkItemEdited(id);
        }
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : (hovered && g.HoveredIdTimer >= hover_visibility_delay) ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, 0.0f);

    return held;
}